

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMModel.hpp
# Opt level: O0

void __thiscall cppjieba::HMMModel::~HMMModel(HMMModel *this)

{
  vector<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
  *unaff_retaddr;
  
  std::
  vector<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*,_std::allocator<std::unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>_*>_>
  ::~vector(unaff_retaddr);
  std::
  unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                    *)0x16f970);
  std::
  unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                    *)0x16f981);
  std::
  unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                    *)0x16f992);
  std::
  unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_double,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                    *)0x16f9a3);
  return;
}

Assistant:

~HMMModel() {
  }